

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O2

void __thiscall IRT::PrintVisitor::Visit(PrintVisitor *this,CCallExpression *expression)

{
  CExpressionList *pCVar1;
  vector<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
  *pvVar2;
  int i;
  ulong uVar3;
  vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> children;
  ChildrenAnswers answers;
  allocator local_d9;
  _Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> local_d8;
  _Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> local_c0;
  ChildrenAnswers local_a8;
  string local_78;
  ChildrenAnswers local_58;
  
  local_d8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.descriptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)CCallExpression::getFunction(expression);
  std::vector<IRT::INode_const*,std::allocator<IRT::INode_const*>>::emplace_back<IRT::INode_const*>
            ((vector<IRT::INode_const*,std::allocator<IRT::INode_const*>> *)&local_d8,
             (INode **)&local_a8);
  uVar3 = 0;
  while( true ) {
    pCVar1 = CCallExpression::getArguments(expression);
    pvVar2 = CExpressionList::getExpressions(pCVar1);
    if ((ulong)((long)(pvVar2->
                      super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(pvVar2->
                      super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar3) break;
    pCVar1 = CCallExpression::getArguments(expression);
    pvVar2 = CExpressionList::getExpressions(pCVar1);
    local_a8.descriptions.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         *(pointer *)
          &(pvVar2->
           super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start[uVar3]._M_t.
           super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
           ._M_t;
    std::vector<IRT::INode_const*,std::allocator<IRT::INode_const*>>::
    emplace_back<IRT::INode_const*>
              ((vector<IRT::INode_const*,std::allocator<IRT::INode_const*>> *)&local_d8,
               (INode **)&local_a8);
    uVar3 = uVar3 + 1;
  }
  std::vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::vector
            ((vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *)&local_c0,
             (vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *)&local_d8);
  VisitChildren(&local_a8,this,
                (vector<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_> *)&local_c0);
  std::_Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::~_Vector_base
            (&local_c0);
  ChildrenAnswers::ChildrenAnswers(&local_58,&local_a8);
  AddChildrenAnswers(this,&local_58);
  ChildrenAnswers::~ChildrenAnswers(&local_58);
  std::__cxx11::string::string((string *)&local_78,"Call",&local_d9);
  AddLabel(this,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  this->lastVisited = this->lastVisited + 1;
  ChildrenAnswers::~ChildrenAnswers(&local_a8);
  std::_Vector_base<const_IRT::INode_*,_std::allocator<const_IRT::INode_*>_>::~_Vector_base
            (&local_d8);
  return;
}

Assistant:

void IRT::PrintVisitor::Visit( const IRT::CCallExpression &expression ) {
    std::vector<const IRT::INode *> children;
    children.push_back( expression.getFunction( ));
    for ( int i = 0; i < expression.getArguments( )->getExpressions( ).size( ); ++i ) {
        children.push_back( expression.getArguments( )->getExpressions( )[ i ].get( ));
    }
    ChildrenAnswers answers = VisitChildren( children );

    AddChildrenAnswers( answers );
    AddLabel( "Call" );
    ++lastVisited;
}